

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

SignalBase<int> * __thiscall
dynamicgraph::SignalPtr<double,_int>::getAbstractPtr(SignalPtr<double,_int> *this)

{
  int iVar1;
  Signal<double,_int> *pSVar2;
  ExceptionSignal *this_00;
  ErrorCodeEnum local_44;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (*this->_vptr_SignalPtr[6])();
  if ((char)iVar1 != '\0') {
    pSVar2 = this->signalPtr;
    if (pSVar2 == (Signal<double,_int> *)0x0) {
      pSVar2 = (Signal<double,_int> *)this->abstractTransmitter;
    }
    return &pSVar2->super_SignalBase<int>;
  }
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_44 = NOT_INITIALIZED;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"In SignalPtr: SIN ptr not set.","");
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_44,(string *)local_40," (in signal <%s>)",
             *(undefined8 *)((long)&this->signalPtr + (long)this->_vptr_SignalPtr[-3]));
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

const SignalBase<Time> *SignalPtr<T, Time>::getAbstractPtr() const {
  if (!isAbstractPluged()) {
    DG_THROW ExceptionSignal(ExceptionSignal::NOT_INITIALIZED,
                             "In SignalPtr: SIN ptr not set.",
                             " (in signal <%s>)", getName().c_str());
  }
  if (NULL != signalPtr)
    return signalPtr;
  else
    return abstractTransmitter;
}